

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

Query * q(QString *qstr)

{
  Query *in_RDI;
  Query *in_stack_00000010;
  
  Query::Query(in_stack_00000010,qstr);
  return in_RDI;
}

Assistant:

Query q(QString &&qstr) { return Query(std::move(qstr)); }